

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils-c.cpp
# Opt level: O1

bool duckdb::FromCBlobCastWrapper::Operation<duckdb_blob,duckdb_string>
               (duckdb_blob input,duckdb_string *result)

{
  bool bVar1;
  duckdb_string *in_RCX;
  uint uVar2;
  string_t input_00;
  string_t input_str;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  uVar2 = (uint)input.size;
  if (uVar2 < 0xd) {
    uStack_c = 0;
    uStack_14 = 0;
    uStack_10 = 0;
    if (uVar2 != 0) {
      switchD_00b1422a::default(&uStack_14,input.data,(ulong)(uVar2 & 0xf));
    }
  }
  else {
    uStack_14 = *input.data;
    uStack_10 = input.data._0_4_;
    uStack_c = input.data._4_4_;
  }
  input_00.value._4_1_ = (undefined1)uStack_c;
  input_00.value._5_1_ = uStack_c._1_1_;
  input_00.value._6_1_ = uStack_c._2_1_;
  input_00.value._7_1_ = uStack_c._3_1_;
  input_00.value.pointer.length = uStack_10;
  input_00.value.pointer.ptr = (char *)result;
  bVar1 = ToCStringCastWrapper<duckdb::CastFromBlob>::Operation<duckdb::string_t,duckdb_string>
                    ((ToCStringCastWrapper<duckdb::CastFromBlob> *)CONCAT44(uStack_14,uVar2),
                     input_00,in_RCX);
  return bVar1;
}

Assistant:

bool FromCBlobCastWrapper::Operation(duckdb_blob input, duckdb_string &result) {
	string_t input_str(const_char_ptr_cast(input.data), UnsafeNumericCast<uint32_t>(input.size));
	return ToCStringCastWrapper<duckdb::CastFromBlob>::template Operation<string_t, duckdb_string>(input_str, result);
}